

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugPubTable.cpp
# Opt level: O0

void __thiscall
llvm::DWARFDebugPubTable::DWARFDebugPubTable
          (DWARFDebugPubTable *this,DWARFObject *Obj,DWARFSection *Sec,bool LittleEndian,
          bool GnuStyle)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  reference pvVar4;
  uint64_t uVar5;
  size_t sVar6;
  StringRef SVar7;
  value_type local_d8;
  char *pcStack_b8;
  StringRef Name;
  uint8_t IndexEntryValue;
  uint32_t DieRef;
  Set *SetData;
  uint64_t local_90;
  uint32_t local_88;
  vector<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_> local_80
  ;
  uint64_t local_68;
  uint64_t Offset;
  undefined1 local_50 [8];
  DWARFDataExtractor PubNames;
  bool GnuStyle_local;
  bool LittleEndian_local;
  DWARFSection *Sec_local;
  DWARFObject *Obj_local;
  DWARFDebugPubTable *this_local;
  
  PubNames.Section._6_1_ = GnuStyle;
  PubNames.Section._7_1_ = LittleEndian;
  std::vector<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>::vector
            (&this->Sets);
  this->GnuStyle = (bool)(PubNames.Section._6_1_ & 1);
  DWARFDataExtractor::DWARFDataExtractor
            ((DWARFDataExtractor *)local_50,Obj,Sec,(bool)(PubNames.Section._7_1_ & 1),'\0');
  local_68 = 0;
  while (bVar1 = DataExtractor::isValidOffset((DataExtractor *)local_50,local_68), bVar1) {
    SetData._0_4_ = 0;
    SetData._4_2_ = 0;
    local_90 = 0;
    local_88 = 0;
    local_80.
    super__Vector_base<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.
    super__Vector_base<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.
    super__Vector_base<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>::
    vector(&local_80);
    std::vector<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>::
    push_back(&this->Sets,(value_type *)&SetData);
    Set::~Set((Set *)&SetData);
    pvVar4 = std::
             vector<llvm::DWARFDebugPubTable::Set,_std::allocator<llvm::DWARFDebugPubTable::Set>_>::
             back(&this->Sets);
    uVar3 = DataExtractor::getU32((DataExtractor *)local_50,&local_68,(Error *)0x0);
    pvVar4->Length = uVar3;
    uVar2 = DataExtractor::getU16((DataExtractor *)local_50,&local_68,(Error *)0x0);
    pvVar4->Version = uVar2;
    uVar5 = DWARFDataExtractor::getRelocatedValue
                      ((DWARFDataExtractor *)local_50,4,&local_68,(uint64_t *)0x0,(Error *)0x0);
    pvVar4->Offset = uVar5;
    uVar3 = DataExtractor::getU32((DataExtractor *)local_50,&local_68,(Error *)0x0);
    pvVar4->Size = uVar3;
    while ((uVar5 = local_68, sVar6 = StringRef::size(&Sec->Data), uVar5 < sVar6 &&
           (Name.Length._4_4_ =
                 DataExtractor::getU32((DataExtractor *)local_50,&local_68,(Error *)0x0),
           Name.Length._4_4_ != 0))) {
      if ((PubNames.Section._6_1_ & 1) == 0) {
        Name.Length._3_1_ = '\0';
      }
      else {
        Name.Length._3_1_ = DataExtractor::getU8((DataExtractor *)local_50,&local_68,(Error *)0x0);
      }
      SVar7 = DataExtractor::getCStrRef((DataExtractor *)local_50,&local_68);
      Name.Data = (char *)SVar7.Length;
      pcStack_b8 = SVar7.Data;
      local_d8.SecOffset = (uint64_t)Name.Length._4_4_;
      dwarf::PubIndexEntryDescriptor::PubIndexEntryDescriptor
                (&local_d8.Descriptor,Name.Length._3_1_);
      local_d8.Name.Data = pcStack_b8;
      local_d8.Name.Length = (size_t)Name.Data;
      std::vector<llvm::DWARFDebugPubTable::Entry,_std::allocator<llvm::DWARFDebugPubTable::Entry>_>
      ::push_back(&pvVar4->Entries,&local_d8);
    }
  }
  return;
}

Assistant:

DWARFDebugPubTable::DWARFDebugPubTable(const DWARFObject &Obj,
                                       const DWARFSection &Sec,
                                       bool LittleEndian, bool GnuStyle)
    : GnuStyle(GnuStyle) {
  DWARFDataExtractor PubNames(Obj, Sec, LittleEndian, 0);
  uint64_t Offset = 0;
  while (PubNames.isValidOffset(Offset)) {
    Sets.push_back({});
    Set &SetData = Sets.back();

    SetData.Length = PubNames.getU32(&Offset);
    SetData.Version = PubNames.getU16(&Offset);
    SetData.Offset = PubNames.getRelocatedValue(4, &Offset);
    SetData.Size = PubNames.getU32(&Offset);

    while (Offset < Sec.Data.size()) {
      uint32_t DieRef = PubNames.getU32(&Offset);
      if (DieRef == 0)
        break;
      uint8_t IndexEntryValue = GnuStyle ? PubNames.getU8(&Offset) : 0;
      StringRef Name = PubNames.getCStrRef(&Offset);
      SetData.Entries.push_back(
          {DieRef, PubIndexEntryDescriptor(IndexEntryValue), Name});
    }
  }
}